

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

string * __thiscall
jessilib::json_parser::serialize_bytes_abi_cxx11_
          (string *__return_storage_ptr__,json_parser *this,object *in_object,
          text_encoding in_write_encoding)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_70;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  text_encoding local_24;
  object *poStack_20;
  text_encoding in_write_encoding_local;
  object *in_object_local;
  json_parser *this_local;
  string *result;
  
  local_24 = in_write_encoding;
  poStack_20 = in_object;
  in_object_local = (object *)this;
  this_local = (json_parser *)__return_storage_ptr__;
  switch(in_write_encoding) {
  case utf_8:
    serialize_impl<char8_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case utf_16:
    serialize_impl<char16_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case utf_16_big:
    serialize_impl<char16_t,char>(__return_storage_ptr__,this,in_object);
    string_byteswap<char16_t>(__return_storage_ptr__);
    break;
  case utf_32:
    serialize_impl<char32_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case utf_32_big:
    serialize_impl<char32_t,char>(__return_storage_ptr__,this,in_object);
    string_byteswap<char32_t>(__return_storage_ptr__);
    break;
  case wchar:
    serialize_impl<wchar_t,char>(__return_storage_ptr__,this,in_object);
    break;
  case multibyte:
    serialize_impl<char8_t,char8_t>(&local_70,this,in_object);
    ustring_to_mbstring<char8_t>(&local_50,&local_70);
    std::__cxx11::string::string((string *)__return_storage_ptr__,&local_50.second);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair(&local_50);
    std::__cxx11::u8string::~u8string((u8string *)&local_70);
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string json_parser::serialize_bytes(const object& in_object, text_encoding in_write_encoding) {
	switch (in_write_encoding) {
		case text_encoding::utf_8:
			return serialize_impl<char8_t, char>(in_object);
		case text_encoding::utf_16:
			return serialize_impl<char16_t, char>(in_object);
		case text_encoding::utf_32:
			return serialize_impl<char32_t, char>(in_object);
		case text_encoding::wchar:
			return serialize_impl<wchar_t, char>(in_object);
		case text_encoding::multibyte:
			return ustring_to_mbstring(serialize_impl<char8_t>(in_object)).second;

			// Other-endianness
		case text_encoding::utf_16_foreign: {
			std::string result = serialize_impl<char16_t, char>(in_object);
			string_byteswap<char16_t>(result);
			return result;
		}
		case text_encoding::utf_32_foreign: {
			std::string result = serialize_impl<char32_t, char>(in_object);
			string_byteswap<char32_t>(result);
			return result;
		}
		default:
			break;
	}

	return {};
}